

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_decoder.h
# Opt level: O0

exr_result_t
LossyDctDecoderCsc_construct
          (LossyDctDecoder *d,DctCoderChannelData *rowPtrsR,DctCoderChannelData *rowPtrsG,
          DctCoderChannelData *rowPtrsB,uint8_t *packedAc,uint8_t *packedAcEnd,uint8_t *packedDc,
          uint64_t remDcCount,uint16_t *toLinear,int width,int height)

{
  exr_result_t eVar1;
  DctCoderChannelData *in_RCX;
  DctCoderChannelData *in_RDX;
  DctCoderChannelData *in_RSI;
  LossyDctDecoder *in_RDI;
  uint8_t *in_R8;
  uint8_t *in_R9;
  uint8_t *in_stack_00000008;
  uint64_t in_stack_00000010;
  uint16_t *in_stack_00000018;
  exr_result_t rv;
  
  eVar1 = LossyDctDecoder_base_construct
                    (in_RDI,in_R8,in_R9,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                     (int)packedAcEnd,(int)packedAc);
  if (eVar1 == 0) {
    in_RDI->_channel_decode_data[0] = in_RSI;
    in_RDI->_channel_decode_data[1] = in_RDX;
    in_RDI->_channel_decode_data[2] = in_RCX;
    in_RDI->_channel_decode_data_count = 3;
  }
  return eVar1;
}

Assistant:

exr_result_t
LossyDctDecoderCsc_construct (
    LossyDctDecoder*     d,
    DctCoderChannelData* rowPtrsR,
    DctCoderChannelData* rowPtrsG,
    DctCoderChannelData* rowPtrsB,
    uint8_t*             packedAc,
    uint8_t*             packedAcEnd,
    uint8_t*             packedDc,
    uint64_t             remDcCount,
    const uint16_t*      toLinear,
    int                  width,
    int                  height)
{
    exr_result_t rv;
    rv = LossyDctDecoder_base_construct (
        d,
        packedAc,
        packedAcEnd,
        packedDc,
        remDcCount,
        toLinear,
        width,
        height);
    if (rv != EXR_ERR_SUCCESS) return rv;

    d->_channel_decode_data[0]    = rowPtrsR;
    d->_channel_decode_data[1]    = rowPtrsG;
    d->_channel_decode_data[2]    = rowPtrsB;
    d->_channel_decode_data_count = 3;

    return rv;
}